

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCompactProtocol.h
# Opt level: O2

void __thiscall
duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::EncryptionTransport>::TCompactProtocolT
          (TCompactProtocolT<duckdb::EncryptionTransport> *this,
          shared_ptr<duckdb::EncryptionTransport> *trans,int32_t string_limit,
          int32_t container_limit)

{
  shared_ptr<duckdb_apache::thrift::transport::TTransport> sStack_38;
  
  std::__shared_ptr<duckdb_apache::thrift::transport::TTransport,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<duckdb::EncryptionTransport,void>
            ((__shared_ptr<duckdb_apache::thrift::transport::TTransport,(__gnu_cxx::_Lock_policy)2>
              *)&sStack_38,
             &trans->super___shared_ptr<duckdb::EncryptionTransport,_(__gnu_cxx::_Lock_policy)2>);
  TVirtualProtocol<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::EncryptionTransport>,_duckdb_apache::thrift::protocol::TProtocolDefaults>
  ::TVirtualProtocol(&this->
                      super_TVirtualProtocol<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::EncryptionTransport>,_duckdb_apache::thrift::protocol::TProtocolDefaults>
                     ,&sStack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sStack_38.
              super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  (this->
  super_TVirtualProtocol<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::EncryptionTransport>,_duckdb_apache::thrift::protocol::TProtocolDefaults>
  ).super_TProtocolDefaults.super_TProtocol._vptr_TProtocol =
       (_func_int **)&PTR__TCompactProtocolT_017bd0b0;
  this->trans_ = (trans->super___shared_ptr<duckdb::EncryptionTransport,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
  std::stack<short,std::deque<short,std::allocator<short>>>::
  stack<std::deque<short,std::allocator<short>>,void>(&this->lastField_);
  this->lastFieldId_ = 0;
  this->string_limit_ = string_limit;
  this->string_buf_ = (uint8_t *)0x0;
  this->string_buf_size_ = 0;
  this->container_limit_ = container_limit;
  (this->booleanField_).name = (char *)0x0;
  (this->boolValue_).hasBoolValue = false;
  return;
}

Assistant:

TCompactProtocolT(std::shared_ptr<Transport_> trans,
                    int32_t string_limit,
                    int32_t container_limit)
    : TVirtualProtocol<TCompactProtocolT<Transport_> >(trans),
      trans_(trans.get()),
      lastFieldId_(0),
      string_limit_(string_limit),
      string_buf_(nullptr),
      string_buf_size_(0),
      container_limit_(container_limit) {
    booleanField_.name = nullptr;
    boolValue_.hasBoolValue = false;
  }